

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  byte *pbVar1;
  byte bVar2;
  sqlite3_vtab *psVar3;
  Fts3Phrase *pFVar4;
  char *pBuf;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *pEnd;
  byte *pbVar9;
  Fts3Expr *pFVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  u8 bEof;
  int rc;
  int iThis;
  sqlite3_int64 iDocid;
  u8 local_6d;
  uint local_6c;
  byte *local_68;
  undefined8 local_60;
  int local_54;
  long local_50;
  int local_44;
  char **local_40;
  Fts3Phrase *local_38;
  
  local_38 = pExpr->pPhrase;
  psVar3 = (pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((local_38->iColumn != iCol) && (local_38->iColumn < *(int *)&psVar3[2].pModule)) {
    return 0;
  }
  lVar15 = pExpr->iDocid;
  local_68 = (byte *)(local_38->doclist).pList;
  local_50 = lVar15;
  local_44 = iCol;
  if ((lVar15 == pCsr->iPrevId) && (pExpr->bEof == '\0')) goto LAB_001c7419;
  local_6c = 0;
  pFVar10 = pExpr->pParent;
  bVar16 = false;
  if (pFVar10 == (Fts3Expr *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = bVar16;
    bVar16 = false;
    do {
      if (pFVar10->eType == 4) {
        bVar5 = true;
      }
      if (pFVar10->eType == 1) {
        pExpr = pFVar10;
      }
      if (pFVar10->bEof != '\0') {
        bVar16 = true;
      }
      pFVar10 = pFVar10->pParent;
    } while (pFVar10 != (Fts3Expr *)0x0);
    bVar5 = !bVar5;
  }
  bVar6 = false;
  pbVar9 = (byte *)0x0;
  if (!bVar5) {
    bVar2 = *(byte *)((long)&psVar3[0x12].zErrMsg + 7);
    local_40 = ppOut;
    if (local_38->bIncr != 0) {
      local_54 = CONCAT31(local_54._1_3_,pExpr->bEof);
      fts3EvalRestart(pCsr,pExpr,(int *)&local_6c);
      if ((local_6c == 0) && (pExpr->bEof == '\0')) {
        do {
          fts3EvalNextRow(pCsr,pExpr,(int *)&local_6c);
          if ((((char)local_54 == '\0') && (pExpr->iDocid == lVar15)) || (local_6c != 0)) break;
        } while (pExpr->bEof == '\0');
      }
    }
    if ((bool)(bVar16 & local_6c == 0)) {
      do {
        if (pExpr->bEof != '\0') break;
        fts3EvalNextRow(pCsr,pExpr,(int *)&local_6c);
      } while (local_6c == 0);
    }
    pbVar9 = (byte *)(ulong)local_6c;
    if (local_6c == 0) {
      if (pExpr != (Fts3Expr *)0x0) {
        local_54 = 1;
LAB_001c723c:
        pFVar10 = pExpr;
        if (pExpr->eType == 1) {
          pFVar10 = pExpr->pRight;
        }
        pFVar4 = pFVar10->pPhrase;
        local_68 = (byte *)pFVar4->pOrPoslist;
        local_50 = pFVar4->iOrDocid;
        iVar7 = (pFVar4->doclist).nAll;
        if (pCsr->bDesc != bVar2) {
          if (iVar7 == 0) {
            local_6d = '\x01';
          }
          else if (local_68 == (byte *)0x0) {
            local_6d = '\0';
          }
          else {
            local_6d = local_68 <= (pFVar4->doclist).aAll;
          }
          do {
            if (local_68 != (byte *)0x0) {
              lVar14 = local_50 - pCsr->iPrevId;
              lVar15 = -lVar14;
              if (bVar2 == 0) {
                lVar15 = lVar14;
              }
              if (lVar15 < 1) goto LAB_001c73bd;
            }
            if (local_6d != '\0') goto LAB_001c73bd;
            sqlite3Fts3DoclistPrev
                      ((uint)bVar2,(pFVar4->doclist).aAll,(pFVar4->doclist).nAll,(char **)&local_68,
                       &local_50,(int *)&local_60,&local_6d);
          } while( true );
        }
        if (iVar7 == 0) {
          local_6d = '\x01';
        }
        else {
          local_6d = (pFVar4->doclist).aAll + iVar7 <= local_68;
        }
LAB_001c72a1:
        if (local_68 != (byte *)0x0) {
          lVar14 = local_50 - pCsr->iPrevId;
          lVar15 = -lVar14;
          if (bVar2 == 0) {
            lVar15 = lVar14;
          }
          if (-1 < lVar15) goto LAB_001c73bd;
        }
        if (local_6d != '\0') goto LAB_001c73bd;
        pBuf = (pFVar4->doclist).aAll;
        if (local_68 == (byte *)0x0) {
          iVar7 = sqlite3Fts3GetVarint(pBuf,&local_50);
          local_68 = (byte *)(pBuf + iVar7);
        }
        else {
          pbVar9 = local_68;
          bVar12 = *local_68;
          if (*local_68 != 0) {
            do {
              pbVar1 = pbVar9 + 1;
              pbVar9 = pbVar9 + 1;
              bVar13 = bVar12 & 0x80;
              bVar12 = *pbVar1;
            } while (bVar13 != 0 || *pbVar1 != 0);
          }
          do {
            pbVar1 = pbVar9 + 1;
            if (pBuf + (pFVar4->doclist).nAll <= pbVar1) {
              local_6d = '\x01';
              local_68 = pbVar9 + 1;
              goto LAB_001c72a1;
            }
            pbVar9 = pbVar1;
          } while (*pbVar1 == 0);
          iVar7 = sqlite3Fts3GetVarint((char *)pbVar1,&local_60);
          local_68 = pbVar1 + iVar7;
          lVar15 = -CONCAT44(local_60._4_4_,(int)local_60);
          if (bVar2 == 0) {
            lVar15 = CONCAT44(local_60._4_4_,(int)local_60);
          }
          local_50 = local_50 + lVar15;
        }
        goto LAB_001c72a1;
      }
      goto LAB_001c73f8;
    }
    bVar6 = false;
    ppOut = local_40;
  }
LAB_001c7411:
  if (!bVar6) {
    return (int)pbVar9;
  }
LAB_001c7419:
  iVar7 = local_44;
  if (local_68 == (byte *)0x0) {
    return 0;
  }
  if (*local_68 == 1) {
    pbVar9 = local_68 + 1;
    if ((char)local_68[1] < '\0') {
      local_68 = pbVar9;
      uVar8 = sqlite3Fts3GetVarint32((char *)pbVar9,(int *)&local_60);
      uVar11 = (ulong)uVar8;
    }
    else {
      uVar11 = 1;
      local_60._0_4_ = (int)(char)local_68[1];
    }
    local_68 = pbVar9 + uVar11;
  }
  else {
    local_60._0_4_ = 0;
  }
  if ((int)local_60 < iVar7) {
    do {
      bVar2 = *local_68;
      if (1 < bVar2) {
        do {
          bVar12 = bVar2 & 0x80;
          bVar2 = local_68[1];
          local_68 = local_68 + 1;
        } while ((bVar2 & 0xfe) != 0 || bVar12 != 0);
      }
      if (*local_68 == 0) {
        return 0;
      }
      pbVar9 = local_68 + 1;
      if ((char)local_68[1] < '\0') {
        local_68 = pbVar9;
        uVar8 = sqlite3Fts3GetVarint32((char *)pbVar9,(int *)&local_60);
        uVar11 = (ulong)uVar8;
      }
      else {
        uVar11 = 1;
        local_60._0_4_ = (int)(char)local_68[1];
      }
      local_68 = pbVar9 + uVar11;
    } while ((int)local_60 < iVar7);
  }
  if (*local_68 == 0) {
    local_68 = (byte *)0x0;
  }
  if ((int)local_60 != iVar7) {
    local_68 = (byte *)0x0;
  }
  *ppOut = (char *)local_68;
  return 0;
LAB_001c73bd:
  pFVar4->pOrPoslist = (char *)local_68;
  pFVar4->iOrDocid = local_50;
  if ((local_6d != '\0') || (local_50 != pCsr->iPrevId)) {
    local_54 = 0;
  }
  pExpr = pExpr->pLeft;
  if (pExpr == (Fts3Expr *)0x0) goto code_r0x001c73f1;
  goto LAB_001c723c;
code_r0x001c73f1:
  if (local_54 == 0) {
    pbVar9 = (byte *)0x0;
  }
  else {
LAB_001c73f8:
    pbVar9 = (byte *)local_38->pOrPoslist;
  }
  bVar6 = true;
  ppOut = local_40;
  local_68 = pbVar9;
  goto LAB_001c7411;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than 
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not, 
    ** return NULL. Otherwise, the entry that corresponds to docid 
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pNear->bEof;
      fts3EvalRestart(pCsr, pNear, &rc);
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
        if( bEofSave==0 && pNear->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}